

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteSwapper.h
# Opt level: O0

void __thiscall
Assimp::Intern::Getter<true,_unsigned_int,_true>::operator()
          (Getter<true,_unsigned_int,_true> *this,uint *inout,bool le)

{
  ByteSwapper<unsigned_int,_false> local_1b;
  ByteSwapper<unsigned_int,_true> local_1a;
  byte local_19;
  uint *puStack_18;
  bool le_local;
  uint *inout_local;
  Getter<true,_unsigned_int,_true> *this_local;
  
  local_19 = (le ^ 0xffU) & 1;
  puStack_18 = inout;
  inout_local = (uint *)this;
  if (local_19 == 0) {
    ByteSwapper<unsigned_int,_false>::operator()(&local_1b,inout);
  }
  else {
    ByteSwapper<unsigned_int,_true>::operator()(&local_1a,inout);
  }
  return;
}

Assistant:

void operator() (T* inout, bool le) {
#ifdef AI_BUILD_BIG_ENDIAN
        le =  le;
#else
        le =  !le;
#endif
        if (le) {
            ByteSwapper<T,(sizeof(T)>1?true:false)> () (inout);
        }
        else ByteSwapper<T,false> () (inout);
    }